

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

bool __thiscall cmTarget::CheckImportedLibName(cmTarget *this,string *prop,string *value)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  undefined8 *puVar3;
  long lVar4;
  long *plVar5;
  long *plVar6;
  ulong *puVar7;
  _Alloc_hider _Var8;
  undefined8 uVar9;
  ulong uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  long local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  long *local_b0;
  undefined8 local_a8;
  long local_a0;
  undefined8 uStack_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  if ((this->TargetTypeValue != INTERFACE_LIBRARY) || (this->IsImportedTarget == false)) {
    pcVar1 = this->Makefile;
    pcVar2 = (prop->_M_dataplus)._M_p;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar2,pcVar2 + prop->_M_string_length);
    std::__cxx11::string::append((char *)&local_f0);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_f0);
    local_60._M_allocated_capacity = local_f0.field_2._M_allocated_capacity;
    _Var8._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
      return false;
    }
    goto LAB_0039aee8;
  }
  if (value->_M_string_length == 0) {
    return true;
  }
  if (*(value->_M_dataplus)._M_p == '-') {
    pcVar1 = this->Makefile;
    pcVar2 = (prop->_M_dataplus)._M_p;
    local_d0 = &local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar2,pcVar2 + prop->_M_string_length);
    std::__cxx11::string::append((char *)&local_d0);
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d0,(ulong)(value->_M_dataplus)._M_p);
    plVar5 = puVar3 + 2;
    if ((long *)*puVar3 == plVar5) {
      local_a0 = *plVar5;
      uStack_98 = puVar3[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar5;
      local_b0 = (long *)*puVar3;
    }
    local_a8 = puVar3[1];
    *puVar3 = plVar5;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
    puVar7 = (ulong *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar7) {
      local_f0.field_2._M_allocated_capacity = *puVar7;
      local_f0.field_2._8_8_ = plVar5[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *puVar7;
      local_f0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f0._M_string_length = plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    local_60._M_allocated_capacity = local_c0._M_allocated_capacity;
    _Var8._M_p = (pointer)local_d0;
    if (local_d0 == &local_c0) {
      return false;
    }
    goto LAB_0039aee8;
  }
  lVar4 = std::__cxx11::string::find_first_of((char *)value,0x64079e,0);
  if (lVar4 == -1) {
    return true;
  }
  pcVar1 = this->Makefile;
  pcVar2 = (prop->_M_dataplus)._M_p;
  local_70[0] = &local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + prop->_M_string_length);
  std::__cxx11::string::append((char *)local_70);
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_70,(ulong)(value->_M_dataplus)._M_p);
  plVar6 = plVar5 + 2;
  if ((long *)*plVar5 == plVar6) {
    local_40 = *plVar6;
    lStack_38 = plVar5[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar6;
    local_50 = (long *)*plVar5;
  }
  local_48 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_c0._M_allocated_capacity = *puVar7;
    local_c0._8_8_ = plVar5[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0._M_allocated_capacity = *puVar7;
    local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar5;
  }
  local_c8 = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::substr((ulong)&local_90,(ulong)value);
  uVar9 = 0xf;
  if (local_d0 != &local_c0) {
    uVar9 = local_c0._M_allocated_capacity;
  }
  if ((ulong)uVar9 < (ulong)(local_88 + local_c8)) {
    uVar10 = 0xf;
    if (local_90 != local_80) {
      uVar10 = local_80[0];
    }
    if (uVar10 < (ulong)(local_88 + local_c8)) goto LAB_0039b14e;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_d0);
  }
  else {
LAB_0039b14e:
    puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90);
  }
  local_b0 = &local_a0;
  plVar5 = puVar3 + 2;
  if ((long *)*puVar3 == plVar5) {
    local_a0 = *plVar5;
    uStack_98 = puVar3[3];
  }
  else {
    local_a0 = *plVar5;
    local_b0 = (long *)*puVar3;
  }
  local_a8 = puVar3[1];
  *puVar3 = plVar5;
  puVar3[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b0);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar7) {
    local_f0.field_2._M_allocated_capacity = *puVar7;
    local_f0.field_2._8_8_ = plVar5[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *puVar7;
    local_f0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_f0._M_string_length = plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0._M_allocated_capacity + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  _Var8._M_p = (pointer)local_70[0];
  if (local_70[0] == &local_60) {
    return false;
  }
LAB_0039aee8:
  operator_delete(_Var8._M_p,local_60._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool cmTarget::CheckImportedLibName(std::string const& prop,
                                    std::string const& value) const
{
  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY ||
      !this->IsImported()) {
    this->Makefile->IssueMessage(
      cmake::FATAL_ERROR, prop +
        " property may be set only on imported INTERFACE library targets.");
    return false;
  }
  if (!value.empty()) {
    if (value[0] == '-') {
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, prop +
                                     " property value\n  " + value +
                                     "\nmay not start with '-'.");
      return false;
    }
    std::string::size_type bad = value.find_first_of(":/\\;");
    if (bad != std::string::npos) {
      this->Makefile->IssueMessage(
        cmake::FATAL_ERROR, prop + " property value\n  " + value +
          "\nmay not contain '" + value.substr(bad, 1) + "'.");
      return false;
    }
  }
  return true;
}